

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVunfreeze_stone(CManager_conflict cm,EVstone stone_id)

{
  stone_type func;
  CMTaskHandle __ptr;
  undefined4 in_ESI;
  long in_RDI;
  CMTaskHandle handle;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x118);
  func = stone_struct(in_stack_ffffffffffffffc8,0);
  if (func == (stone_type)0x0) {
    local_4 = -1;
  }
  else {
    func->is_frozen = 0;
    __ptr = INT_CMadd_delayed_task
                      ((CManager_conflict)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       (int)((ulong)uVar1 >> 0x20),(int)uVar1,(CMPollFunc)func,
                       in_stack_ffffffffffffffd0);
    free(__ptr);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

extern int
INT_EVunfreeze_stone(CManager cm, EVstone stone_id)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    CMTaskHandle handle;
    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;

    stone->is_frozen = 0;
    /* ensure that we run the process_actions loop soon so the stone's
       pending events (or pending output) won't be ignored */
    handle = INT_CMadd_delayed_task(cm, 0, 0, deferred_process_actions, NULL);
    free(handle); /* we don't need this */
    return 1;	
}